

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5Parser.cpp
# Opt level: O3

void __thiscall
Assimp::MD5::MD5AnimParser::MD5AnimParser(MD5AnimParser *this,SectionList *mSections)

{
  AnimBoneList *this_00;
  string *psVar1;
  char *pcVar2;
  pointer *ppfVar3;
  pointer pSVar4;
  pointer pAVar5;
  iterator __position;
  pointer pFVar6;
  pointer pEVar7;
  iterator __position_00;
  byte bVar8;
  int iVar9;
  Logger *pLVar10;
  ulong uVar11;
  char *pcVar12;
  char cVar13;
  char *pcVar14;
  byte bVar15;
  int iVar16;
  uint uVar17;
  byte *pbVar18;
  size_type sVar19;
  Element *elem;
  pointer pEVar20;
  pointer pSVar21;
  Element *elem_2;
  pointer pBVar22;
  byte *pbVar23;
  Element *elem_1;
  float f;
  undefined1 local_448 [8];
  pointer pfStack_440;
  pointer local_438;
  pointer pfStack_430;
  
  this_00 = &this->mAnimatedBones;
  (this->mFrames).
  super__Vector_base<Assimp::MD5::FrameDesc,_std::allocator<Assimp::MD5::FrameDesc>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mFrames).
  super__Vector_base<Assimp::MD5::FrameDesc,_std::allocator<Assimp::MD5::FrameDesc>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mBaseFrames).
  super__Vector_base<Assimp::MD5::BaseFrameDesc,_std::allocator<Assimp::MD5::BaseFrameDesc>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mBaseFrames).
  super__Vector_base<Assimp::MD5::BaseFrameDesc,_std::allocator<Assimp::MD5::BaseFrameDesc>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mAnimatedBones).
  super__Vector_base<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mBaseFrames).
  super__Vector_base<Assimp::MD5::BaseFrameDesc,_std::allocator<Assimp::MD5::BaseFrameDesc>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mAnimatedBones).
  super__Vector_base<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mAnimatedBones).
  super__Vector_base<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mFrames).
  super__Vector_base<Assimp::MD5::FrameDesc,_std::allocator<Assimp::MD5::FrameDesc>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pLVar10 = DefaultLogger::get();
  Logger::debug(pLVar10,"MD5AnimParser begin");
  this->fFrameRate = 24.0;
  this->mNumAnimatedComponents = 0xffffffff;
  pSVar21 = (mSections->
            super__Vector_base<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>)._M_impl
            .super__Vector_impl_data._M_start;
  pSVar4 = (mSections->
           super__Vector_base<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  do {
    if (pSVar21 == pSVar4) {
      pLVar10 = DefaultLogger::get();
      Logger::debug(pLVar10,"MD5AnimParser end");
      return;
    }
    psVar1 = &pSVar21->mName;
    iVar9 = std::__cxx11::string::compare((char *)psVar1);
    if (iVar9 == 0) {
      pEVar7 = (pSVar21->mElements).
               super__Vector_base<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      for (pEVar20 = (pSVar21->mElements).
                     super__Vector_base<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>
                     ._M_impl.super__Vector_impl_data._M_start; pEVar20 != pEVar7;
          pEVar20 = pEVar20 + 1) {
        memset((AnimBoneDesc *)local_448,0,0x410);
        memset(local_448 + 5,0x1b,0x3ff);
        std::vector<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>::
        emplace_back<Assimp::MD5::AnimBoneDesc>(this_00,(AnimBoneDesc *)local_448);
        pAVar5 = (this->mAnimatedBones).
                 super__Vector_base<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pbVar23 = (byte *)(pEVar20->szStart + 2);
        pcVar12 = pEVar20->szStart;
        do {
          pcVar14 = pcVar12;
          pbVar18 = pbVar23;
          pcVar12 = pcVar14 + 1;
          pbVar23 = pbVar18 + 1;
        } while (*pcVar14 != '\"');
        uVar17 = 0xffffffff;
        do {
          pbVar23 = pbVar18;
          uVar17 = uVar17 + 1;
          pcVar2 = pcVar14 + 1;
          pcVar14 = pcVar14 + 1;
          pbVar18 = pbVar23 + 1;
        } while (*pcVar2 != '\"');
        pAVar5[-1].super_BaseJointDescription.mName.length = uVar17;
        memcpy(pAVar5[-1].super_BaseJointDescription.mName.data,pcVar12,(ulong)uVar17);
        *(undefined1 *)((long)pAVar5 + ((ulong)uVar17 - 0x40c)) = 0;
        while( true ) {
          bVar8 = *pbVar23;
          uVar11 = (ulong)bVar8;
          if (0x20 < uVar11) break;
          if ((0x100000200U >> (uVar11 & 0x3f) & 1) == 0) {
            if ((0x3401UL >> (uVar11 & 0x3f) & 1) != 0) {
              MD5Parser::ReportWarning("Unexpected end of line",pEVar20->iLineNumber);
              bVar8 = *pbVar23;
            }
            break;
          }
          pbVar23 = pbVar23 + 1;
        }
        pbVar23 = pbVar23 + ((bVar8 - 0x2b & 0xfd) == 0);
        bVar15 = *pbVar23;
        iVar9 = 0;
        if (0xf5 < (byte)(bVar15 - 0x3a)) {
          iVar9 = 0;
          do {
            iVar9 = (uint)(byte)(bVar15 - 0x30) + iVar9 * 10;
            bVar15 = pbVar23[1];
            pbVar23 = pbVar23 + 1;
          } while (0xf5 < (byte)(bVar15 - 0x3a));
        }
        iVar16 = -iVar9;
        if (bVar8 != 0x2d) {
          iVar16 = iVar9;
        }
        pAVar5[-1].super_BaseJointDescription.mParentIndex = iVar16;
        for (; uVar11 = (ulong)*pbVar23, uVar11 < 0x21; pbVar23 = pbVar23 + 1) {
          if ((0x100000200U >> (uVar11 & 0x3f) & 1) == 0) {
            if ((0x3401UL >> (uVar11 & 0x3f) & 1) != 0) {
              MD5Parser::ReportWarning("Unexpected end of line",pEVar20->iLineNumber);
              uVar11 = (ulong)*pbVar23;
            }
            break;
          }
        }
        if ((byte)((char)uVar11 - 0x3aU) < 0xf6) {
          pAVar5[-1].iFlags = 0;
          pbVar18 = pbVar23;
        }
        else {
          uVar17 = 0;
          do {
            uVar17 = (uint)(byte)((char)uVar11 - 0x30) + uVar17 * 10;
            pbVar18 = pbVar23 + 1;
            uVar11 = (ulong)*pbVar18;
            pbVar23 = pbVar23 + 1;
          } while (0xf5 < (byte)(*pbVar18 - 0x3a));
          pAVar5[-1].iFlags = uVar17;
          pbVar18 = pbVar23;
          if (0x3f < uVar17) {
            MD5Parser::ReportWarning
                      ("Invalid flag combination in hierarchy section",pEVar20->iLineNumber);
          }
        }
        while( true ) {
          pbVar18 = pbVar18 + 1;
          uVar11 = (ulong)*pbVar23;
          if (0x20 < uVar11) break;
          if ((0x100000200U >> (uVar11 & 0x3f) & 1) == 0) {
            if ((0x3401UL >> (uVar11 & 0x3f) & 1) != 0) {
              MD5Parser::ReportWarning("Unexpected end of line",pEVar20->iLineNumber);
              uVar11 = (ulong)*pbVar23;
            }
            break;
          }
          pbVar23 = pbVar23 + 1;
        }
        uVar17 = 0;
        if (0xf5 < (byte)((char)uVar11 - 0x3aU)) {
          uVar17 = 0;
          do {
            uVar17 = (uint)(byte)((char)uVar11 - 0x30) + uVar17 * 10;
            bVar8 = *pbVar18;
            uVar11 = (ulong)bVar8;
            pbVar18 = pbVar18 + 1;
          } while (0xf5 < (byte)(bVar8 - 0x3a));
        }
        pAVar5[-1].iFirstKeyIndex = uVar17;
      }
    }
    else {
      iVar9 = std::__cxx11::string::compare((char *)psVar1);
      if (iVar9 == 0) {
        pEVar7 = (pSVar21->mElements).
                 super__Vector_base<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        for (pEVar20 = (pSVar21->mElements).
                       super__Vector_base<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>
                       ._M_impl.super__Vector_impl_data._M_start; pEVar20 != pEVar7;
            pEVar20 = pEVar20 + 1) {
          pbVar23 = (byte *)pEVar20->szStart;
          local_448._0_4_ = 0;
          local_448[4] = '\0';
          local_448[5] = '\0';
          local_448[6] = '\0';
          local_448[7] = '\0';
          pfStack_440 = (pointer)0x0;
          local_438 = (pointer)0x0;
          __position._M_current =
               (this->mBaseFrames).
               super__Vector_base<Assimp::MD5::BaseFrameDesc,_std::allocator<Assimp::MD5::BaseFrameDesc>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (this->mBaseFrames).
              super__Vector_base<Assimp::MD5::BaseFrameDesc,_std::allocator<Assimp::MD5::BaseFrameDesc>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<Assimp::MD5::BaseFrameDesc,_std::allocator<Assimp::MD5::BaseFrameDesc>_>::
            _M_realloc_insert<Assimp::MD5::BaseFrameDesc>
                      (&this->mBaseFrames,__position,(BaseFrameDesc *)local_448);
            pBVar22 = (this->mBaseFrames).
                      super__Vector_base<Assimp::MD5::BaseFrameDesc,_std::allocator<Assimp::MD5::BaseFrameDesc>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          }
          else {
            ((__position._M_current)->vPositionXYZ).x = 0.0;
            ((__position._M_current)->vPositionXYZ).y = 0.0;
            *(undefined8 *)&((__position._M_current)->vPositionXYZ).z = 0;
            ((__position._M_current)->vRotationQuat).y = 0.0;
            ((__position._M_current)->vRotationQuat).z = 0.0;
            pBVar22 = (this->mBaseFrames).
                      super__Vector_base<Assimp::MD5::BaseFrameDesc,_std::allocator<Assimp::MD5::BaseFrameDesc>_>
                      ._M_impl.super__Vector_impl_data._M_finish + 1;
            (this->mBaseFrames).
            super__Vector_base<Assimp::MD5::BaseFrameDesc,_std::allocator<Assimp::MD5::BaseFrameDesc>_>
            ._M_impl.super__Vector_impl_data._M_finish = pBVar22;
          }
          pbVar18 = pbVar23;
          while( true ) {
            pbVar18 = pbVar18 + 1;
            bVar8 = *pbVar23;
            uVar11 = (ulong)bVar8;
            if (0x20 < uVar11) break;
            if ((0x100000200U >> (uVar11 & 0x3f) & 1) == 0) {
              if ((0x3401UL >> (uVar11 & 0x3f) & 1) != 0) {
                MD5Parser::ReportWarning("Unexpected end of line",pEVar20->iLineNumber);
                bVar8 = *pbVar23;
              }
              break;
            }
            pbVar23 = pbVar23 + 1;
          }
          if (bVar8 != 0x28) {
            MD5Parser::ReportWarning("Unexpected token: ( was expected",pEVar20->iLineNumber);
          }
          for (; uVar11 = (ulong)*pbVar18, uVar11 < 0x21; pbVar18 = pbVar18 + 1) {
            if ((0x100000200U >> (uVar11 & 0x3f) & 1) == 0) {
              if ((0x3401UL >> (uVar11 & 0x3f) & 1) != 0) {
                MD5Parser::ReportWarning("Unexpected end of line",pEVar20->iLineNumber);
              }
              break;
            }
          }
          for (pbVar23 = (byte *)fast_atoreal_move<float>
                                           ((char *)pbVar18,(float *)(pBVar22 + -1),true);
              uVar11 = (ulong)*pbVar23, uVar11 < 0x21; pbVar23 = pbVar23 + 1) {
            if ((0x100000200U >> (uVar11 & 0x3f) & 1) == 0) {
              if ((0x3401UL >> (uVar11 & 0x3f) & 1) != 0) {
                MD5Parser::ReportWarning("Unexpected end of line",pEVar20->iLineNumber);
              }
              break;
            }
          }
          for (pbVar23 = (byte *)fast_atoreal_move<float>
                                           ((char *)pbVar23,&pBVar22[-1].vPositionXYZ.y,true);
              uVar11 = (ulong)*pbVar23, uVar11 < 0x21; pbVar23 = pbVar23 + 1) {
            if ((0x100000200U >> (uVar11 & 0x3f) & 1) == 0) {
              if ((0x3401UL >> (uVar11 & 0x3f) & 1) != 0) {
                MD5Parser::ReportWarning("Unexpected end of line",pEVar20->iLineNumber);
              }
              break;
            }
          }
          pbVar23 = (byte *)fast_atoreal_move<float>
                                      ((char *)pbVar23,&pBVar22[-1].vPositionXYZ.z,true);
          pbVar18 = pbVar23 + 2;
          while( true ) {
            bVar8 = *pbVar23;
            uVar11 = (ulong)bVar8;
            if (0x20 < uVar11) break;
            if ((0x100000200U >> (uVar11 & 0x3f) & 1) == 0) {
              if ((0x3401UL >> (uVar11 & 0x3f) & 1) != 0) {
                MD5Parser::ReportWarning("Unexpected end of line",pEVar20->iLineNumber);
                bVar8 = *pbVar23;
              }
              break;
            }
            pbVar23 = pbVar23 + 1;
            pbVar18 = pbVar18 + 1;
          }
          if (bVar8 != 0x29) {
            MD5Parser::ReportWarning("Unexpected token: ) was expected",pEVar20->iLineNumber);
          }
          while( true ) {
            bVar8 = pbVar18[-1];
            uVar11 = (ulong)bVar8;
            if (0x20 < uVar11) break;
            if ((0x100000200U >> (uVar11 & 0x3f) & 1) == 0) {
              if ((0x3401UL >> (uVar11 & 0x3f) & 1) != 0) {
                MD5Parser::ReportWarning("Unexpected end of line",pEVar20->iLineNumber);
                bVar8 = pbVar18[-1];
              }
              break;
            }
            pbVar18 = pbVar18 + 1;
          }
          if (bVar8 != 0x28) {
            MD5Parser::ReportWarning("Unexpected token: ( was expected",pEVar20->iLineNumber);
          }
          for (; uVar11 = (ulong)*pbVar18, uVar11 < 0x21; pbVar18 = pbVar18 + 1) {
            if ((0x100000200U >> (uVar11 & 0x3f) & 1) == 0) {
              if ((0x3401UL >> (uVar11 & 0x3f) & 1) != 0) {
                MD5Parser::ReportWarning("Unexpected end of line",pEVar20->iLineNumber);
              }
              break;
            }
          }
          for (pbVar23 = (byte *)fast_atoreal_move<float>
                                           ((char *)pbVar18,&pBVar22[-1].vRotationQuat.x,true);
              uVar11 = (ulong)*pbVar23, uVar11 < 0x21; pbVar23 = pbVar23 + 1) {
            if ((0x100000200U >> (uVar11 & 0x3f) & 1) == 0) {
              if ((0x3401UL >> (uVar11 & 0x3f) & 1) != 0) {
                MD5Parser::ReportWarning("Unexpected end of line",pEVar20->iLineNumber);
              }
              break;
            }
          }
          for (pbVar23 = (byte *)fast_atoreal_move<float>
                                           ((char *)pbVar23,&pBVar22[-1].vRotationQuat.y,true);
              uVar11 = (ulong)*pbVar23, uVar11 < 0x21; pbVar23 = pbVar23 + 1) {
            if ((0x100000200U >> (uVar11 & 0x3f) & 1) == 0) {
              if ((0x3401UL >> (uVar11 & 0x3f) & 1) != 0) {
                MD5Parser::ReportWarning("Unexpected end of line",pEVar20->iLineNumber);
              }
              break;
            }
          }
          pbVar23 = (byte *)fast_atoreal_move<float>
                                      ((char *)pbVar23,&pBVar22[-1].vRotationQuat.z,true);
          while( true ) {
            bVar8 = *pbVar23;
            uVar11 = (ulong)bVar8;
            if (0x20 < uVar11) break;
            if ((0x100000200U >> (uVar11 & 0x3f) & 1) == 0) {
              if ((0x3401UL >> (uVar11 & 0x3f) & 1) != 0) {
                MD5Parser::ReportWarning("Unexpected end of line",pEVar20->iLineNumber);
                bVar8 = *pbVar23;
              }
              break;
            }
            pbVar23 = pbVar23 + 1;
          }
          if (bVar8 != 0x29) {
            MD5Parser::ReportWarning("Unexpected token: ) was expected",pEVar20->iLineNumber);
          }
        }
      }
      else {
        iVar9 = std::__cxx11::string::compare((char *)psVar1);
        if (iVar9 == 0) {
          if ((pSVar21->mGlobalValue)._M_string_length == 0) {
            MD5Parser::ReportWarning("A frame section must have a frame index",pSVar21->iLineNumber)
            ;
          }
          else {
            local_438 = (pointer)0x0;
            pfStack_430 = (pointer)0x0;
            local_448._0_4_ = 0;
            local_448[4] = '\0';
            local_448[5] = '\0';
            local_448[6] = '\0';
            local_448[7] = '\0';
            pfStack_440 = (pointer)0x0;
            std::vector<Assimp::MD5::FrameDesc,_std::allocator<Assimp::MD5::FrameDesc>_>::
            emplace_back<Assimp::MD5::FrameDesc>(&this->mFrames,(FrameDesc *)local_448);
            if (pfStack_440 != (pointer)0x0) {
              operator_delete(pfStack_440);
            }
            pFVar6 = (this->mFrames).
                     super__Vector_base<Assimp::MD5::FrameDesc,_std::allocator<Assimp::MD5::FrameDesc>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            pcVar12 = (pSVar21->mGlobalValue)._M_dataplus._M_p;
            cVar13 = *pcVar12;
            uVar17 = 0;
            if (0xf5 < (byte)(cVar13 - 0x3aU)) {
              uVar17 = 0;
              do {
                pcVar12 = pcVar12 + 1;
                uVar17 = (uint)(byte)(cVar13 - 0x30) + uVar17 * 10;
                cVar13 = *pcVar12;
              } while (0xf5 < (byte)(cVar13 - 0x3aU));
            }
            pFVar6[-1].iIndex = uVar17;
            if ((ulong)this->mNumAnimatedComponents != 0xffffffff) {
              std::vector<float,_std::allocator<float>_>::reserve
                        (&pFVar6[-1].mValues,(ulong)this->mNumAnimatedComponents);
            }
            pEVar20 = (pSVar21->mElements).
                      super__Vector_base<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pEVar7 = (pSVar21->mElements).
                     super__Vector_base<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            if (pEVar20 != pEVar7) {
              do {
                pbVar23 = (byte *)pEVar20->szStart;
LAB_00447075:
                while (uVar11 = (ulong)*pbVar23, 0x20 < uVar11) {
LAB_00447099:
                  pbVar23 = (byte *)fast_atoreal_move<float>
                                              ((char *)pbVar23,(float *)local_448,true);
                  __position_00._M_current =
                       pFVar6[-1].mValues.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish;
                  if (__position_00._M_current ==
                      pFVar6[-1].mValues.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
                    std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                              ((vector<float,std::allocator<float>> *)&pFVar6[-1].mValues,
                               __position_00,(float *)local_448);
                  }
                  else {
                    *__position_00._M_current = (float)local_448._0_4_;
                    ppfVar3 = &pFVar6[-1].mValues.super__Vector_base<float,_std::allocator<float>_>.
                               _M_impl.super__Vector_impl_data._M_finish;
                    *ppfVar3 = *ppfVar3 + 1;
                  }
                }
                if ((0x100002600U >> (uVar11 & 0x3f) & 1) != 0) {
                  pbVar23 = pbVar23 + 1;
                  goto LAB_00447075;
                }
                if (uVar11 != 0) goto LAB_00447099;
                pEVar20 = pEVar20 + 1;
              } while (pEVar20 != pEVar7);
            }
          }
        }
        else {
          iVar9 = std::__cxx11::string::compare((char *)psVar1);
          if (iVar9 == 0) {
            pcVar12 = (pSVar21->mGlobalValue)._M_dataplus._M_p;
            cVar13 = *pcVar12;
            if ((byte)(cVar13 - 0x3aU) < 0xf6) {
              sVar19 = 0;
            }
            else {
              uVar17 = 0;
              do {
                pcVar12 = pcVar12 + 1;
                uVar17 = (uint)(byte)(cVar13 - 0x30) + uVar17 * 10;
                cVar13 = *pcVar12;
              } while (0xf5 < (byte)(cVar13 - 0x3aU));
              sVar19 = (size_type)uVar17;
            }
            std::vector<Assimp::MD5::FrameDesc,_std::allocator<Assimp::MD5::FrameDesc>_>::reserve
                      (&this->mFrames,sVar19);
          }
          else {
            iVar9 = std::__cxx11::string::compare((char *)psVar1);
            if (iVar9 == 0) {
              pcVar12 = (pSVar21->mGlobalValue)._M_dataplus._M_p;
              cVar13 = *pcVar12;
              uVar17 = 0;
              if (0xf5 < (byte)(cVar13 - 0x3aU)) {
                uVar17 = 0;
                do {
                  pcVar12 = pcVar12 + 1;
                  uVar17 = (uint)(byte)(cVar13 - 0x30) + uVar17 * 10;
                  cVar13 = *pcVar12;
                } while (0xf5 < (byte)(cVar13 - 0x3aU));
              }
              std::vector<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>::
              reserve(this_00,(ulong)uVar17);
              if (this->mNumAnimatedComponents == 0xffffffff) {
                this->mNumAnimatedComponents = uVar17 * 6;
              }
            }
            else {
              iVar9 = std::__cxx11::string::compare((char *)psVar1);
              if (iVar9 == 0) {
                pcVar12 = (pSVar21->mGlobalValue)._M_dataplus._M_p;
                cVar13 = *pcVar12;
                if ((byte)(cVar13 - 0x3aU) < 0xf6) {
                  sVar19 = 0;
                }
                else {
                  uVar17 = 0;
                  do {
                    pcVar12 = pcVar12 + 1;
                    uVar17 = (uint)(byte)(cVar13 - 0x30) + uVar17 * 10;
                    cVar13 = *pcVar12;
                  } while (0xf5 < (byte)(cVar13 - 0x3aU));
                  sVar19 = (size_type)uVar17;
                }
                std::vector<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>::
                reserve(this_00,sVar19);
              }
              else {
                iVar9 = std::__cxx11::string::compare((char *)psVar1);
                if (iVar9 == 0) {
                  fast_atoreal_move<float>
                            ((pSVar21->mGlobalValue)._M_dataplus._M_p,&this->fFrameRate,true);
                }
              }
            }
          }
        }
      }
    }
    pSVar21 = pSVar21 + 1;
  } while( true );
}

Assistant:

MD5AnimParser::MD5AnimParser(SectionList& mSections)
{
    ASSIMP_LOG_DEBUG("MD5AnimParser begin");

    fFrameRate = 24.0f;
    mNumAnimatedComponents = UINT_MAX;
    for (SectionList::const_iterator iter =  mSections.begin(), iterEnd = mSections.end();iter != iterEnd;++iter) {
        if ((*iter).mName == "hierarchy")   {
            // "sheath" 0 63 6
            for (const auto & elem : (*iter).mElements) {
                mAnimatedBones.push_back ( AnimBoneDesc () );
                AnimBoneDesc& desc = mAnimatedBones.back();

                const char* sz = elem.szStart;
                AI_MD5_PARSE_STRING_IN_QUOTATION(desc.mName);
                AI_MD5_SKIP_SPACES();

                // parent index - negative values are allowed (at least -1)
                desc.mParentIndex = ::strtol10(sz,&sz);

                // flags (highest is 2^6-1)
                AI_MD5_SKIP_SPACES();
                if(63 < (desc.iFlags = ::strtoul10(sz,&sz))){
                    MD5Parser::ReportWarning("Invalid flag combination in hierarchy section",elem.iLineNumber);
                }
                AI_MD5_SKIP_SPACES();

                // index of the first animation keyframe component for this joint
                desc.iFirstKeyIndex = ::strtoul10(sz,&sz);
            }
        }
        else if((*iter).mName == "baseframe")   {
            // ( -0.000000 0.016430 -0.006044 ) ( 0.707107 0.000242 0.707107 )
            for (const auto & elem : (*iter).mElements) {
                const char* sz = elem.szStart;

                mBaseFrames.push_back ( BaseFrameDesc () );
                BaseFrameDesc& desc = mBaseFrames.back();

                AI_MD5_READ_TRIPLE(desc.vPositionXYZ);
                AI_MD5_READ_TRIPLE(desc.vRotationQuat);
            }
        }
        else if((*iter).mName ==  "frame")  {
            if (!(*iter).mGlobalValue.length()) {
                MD5Parser::ReportWarning("A frame section must have a frame index",(*iter).iLineNumber);
                continue;
            }

            mFrames.push_back ( FrameDesc () );
            FrameDesc& desc = mFrames.back();
            desc.iIndex = strtoul10((*iter).mGlobalValue.c_str());

            // we do already know how much storage we will presumably need
            if (UINT_MAX != mNumAnimatedComponents) {
                desc.mValues.reserve(mNumAnimatedComponents);
            }

            // now read all elements (continuous list of floats)
            for (const auto & elem : (*iter).mElements){
                const char* sz = elem.szStart;
                while (SkipSpacesAndLineEnd(&sz))   {
                    float f;sz = fast_atoreal_move<float>(sz,f);
                    desc.mValues.push_back(f);
                }
            }
        }
        else if((*iter).mName == "numFrames")   {
            mFrames.reserve(strtoul10((*iter).mGlobalValue.c_str()));
        }
        else if((*iter).mName == "numJoints")   {
            const unsigned int num = strtoul10((*iter).mGlobalValue.c_str());
            mAnimatedBones.reserve(num);

            // try to guess the number of animated components if that element is not given
            if (UINT_MAX  == mNumAnimatedComponents) {
                mNumAnimatedComponents = num * 6;
            }
        }
        else if((*iter).mName == "numAnimatedComponents")   {
            mAnimatedBones.reserve( strtoul10((*iter).mGlobalValue.c_str()));
        }
        else if((*iter).mName == "frameRate")   {
            fast_atoreal_move<float>((*iter).mGlobalValue.c_str(),fFrameRate);
        }
    }
    ASSIMP_LOG_DEBUG("MD5AnimParser end");
}